

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

void __thiscall tt::LogStream::formatInteger<int>(LogStream *this,int v)

{
  char *buf;
  size_t sVar1;
  char **ppcVar2;
  
  buf = (this->m_buffer).m_cur;
  ppcVar2 = &(this->m_buffer).m_cur;
  if (0x1f < (int)ppcVar2 - (int)buf) {
    sVar1 = detail::convert<int>(buf,v);
    *ppcVar2 = *ppcVar2 + sVar1;
  }
  return;
}

Assistant:

void LogStream::formatInteger(T v){
	if(m_buffer.avail() >= kMaxNumbericSize){ //把整数变成字符串存入
		size_t len = convert(m_buffer.current(), v);
		m_buffer.add(len);
	}

}